

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O3

AmsResponse * __thiscall
AmsConnection::Write(AmsConnection *this,AmsRequest *request,AmsAddr srcAddr)

{
  atomic<unsigned_int> *paVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  AmsAddr *pAVar4;
  size_t sVar5;
  AmsResponse *pAVar6;
  size_t sVar7;
  size_t __n;
  void *__buf;
  AmsTcpHeader header;
  AoEHeader aoeHeader;
  undefined2 local_56;
  undefined4 local_54;
  undefined4 local_50;
  undefined2 local_4c;
  uint16_t local_4a;
  undefined4 local_48;
  undefined2 local_44;
  uint16_t local_42;
  uint16_t local_40;
  undefined2 local_3e;
  undefined4 local_3c;
  undefined4 local_38;
  uint local_34;
  
  pAVar4 = request->destAddr;
  uVar2 = pAVar4->port;
  uVar3 = request->cmdId;
  sVar5 = Frame::size(&request->frame);
  do {
    LOCK();
    paVar1 = &this->invokeId;
    local_34 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
    __n = (size_t)local_34;
    (paVar1->super___atomic_base<unsigned_int>)._M_i =
         (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
  } while (local_34 == 0);
  local_4c = *(undefined2 *)((pAVar4->netId).b + 4);
  local_50 = *(undefined4 *)(pAVar4->netId).b;
  local_48 = srcAddr.netId.b._0_4_;
  local_44 = srcAddr.netId.b._4_2_;
  local_3e = 4;
  local_3c = (undefined4)sVar5;
  local_38 = 0;
  local_4a = uVar2;
  local_42 = srcAddr.port;
  local_40 = uVar3;
  Frame::prepend(&request->frame,&local_50,0x20);
  sVar5 = Frame::size(&request->frame);
  local_56 = 0;
  local_54 = (undefined4)sVar5;
  Frame::prepend(&request->frame,&local_56,6);
  pAVar6 = Reserve(this,request,srcAddr.port);
  if (pAVar6 != (AmsResponse *)0x0) {
    LOCK();
    (pAVar6->invokeId).super___atomic_base<unsigned_int>._M_i = local_34;
    UNLOCK();
    sVar5 = Frame::size(&request->frame);
    sVar7 = Socket::write(&(this->socket).super_Socket,(int)request,__buf,__n);
    if (sVar5 == sVar7) {
      return pAVar6;
    }
    pAVar6->errorCode = 0xffffffff;
    LOCK();
    (pAVar6->request)._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
  }
  return (AmsResponse *)0x0;
}

Assistant:

AmsResponse* AmsConnection::Write(AmsRequest& request, const AmsAddr srcAddr)
{
    const AoEHeader aoeHeader {
        request.destAddr.netId, request.destAddr.port,
        srcAddr.netId, srcAddr.port,
        request.cmdId,
        static_cast<uint32_t>(request.frame.size()),
        GetInvokeId()
    };
    request.frame.prepend<AoEHeader>(aoeHeader);

    const AmsTcpHeader header { static_cast<uint32_t>(request.frame.size()) };
    request.frame.prepend<AmsTcpHeader>(header);

    auto response = Reserve(&request, srcAddr.port);

    if (!response) {
        return nullptr;
    }

    response->invokeId.store(aoeHeader.invokeId());
    if (request.frame.size() != socket.write(request.frame)) {
        response->Release();
        return nullptr;
    }
    return response;
}